

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O3

void __thiscall
adios2::transport::FileStdio::Read(FileStdio *this,char *buffer,size_t size,size_t start)

{
  size_type *psVar1;
  bool bVar2;
  uint __val;
  uint uVar3;
  char cVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  size_t sVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  char cVar13;
  uint __len;
  string __str_1;
  string __str;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  WaitForOpen(this);
  if (start == 0xffffffffffffffff) goto LAB_0063726b;
  uVar5 = fseek((FILE *)this->m_File,start,0);
  cVar13 = '\x01';
  if (9 < start) {
    sVar9 = start;
    cVar4 = '\x04';
    do {
      cVar13 = cVar4;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_00636eec;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_00636eec;
      }
      if (sVar9 < 10000) goto LAB_00636eec;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_00636eec:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,start);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x74daa0);
  local_b0 = &local_a0;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_a0 = *plVar10;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *plVar10;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90 = &local_80;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_80 = *plVar10;
    lStack_78 = plVar6[3];
  }
  else {
    local_80 = *plVar10;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,
                              (ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
  local_70 = &local_60;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_60 = *plVar10;
    lStack_58 = plVar6[3];
  }
  else {
    local_60 = *plVar10;
    local_70 = (long *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_110 = &local_100;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_100 = *puVar11;
    lStack_f8 = plVar6[3];
  }
  else {
    local_100 = *puVar11;
    local_110 = (ulong *)*plVar6;
  }
  local_108 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  __val = -uVar5;
  if (0 < (int)uVar5) {
    __val = uVar5;
  }
  __len = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar8 = (uint)uVar12;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_006370ee;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_006370ee;
      }
      if (uVar8 < 10000) goto LAB_006370ee;
      uVar12 = uVar12 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_006370ee:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)__len - (char)((int)uVar5 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_f0),__len,__val);
  uVar12 = 0xf;
  if (local_110 != &local_100) {
    uVar12 = local_100;
  }
  if (uVar12 < (ulong)(local_e8 + local_108)) {
    uVar12 = 0xf;
    if (local_f0 != local_e0) {
      uVar12 = local_e0[0];
    }
    if (uVar12 < (ulong)(local_e8 + local_108)) goto LAB_0063716a;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0063716a:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0.field_2._8_8_ = puVar7[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_d0._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  CheckFile(this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
LAB_0063726b:
  if (0x7ffe7000 < size) {
    uVar12 = size / 0x7ffe7000;
    size = size % 0x7ffe7000;
    do {
      Read::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this,buffer,0x7ffe7000);
      buffer = buffer + 0x7ffe7000;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  Read::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this,buffer,size);
  return;
}

Assistant:

void FileStdio::Read(char *buffer, size_t size, size_t start)
{
    auto lf_Read = [&](char *buffer, size_t size) {
        ProfilerStart("read");
        const auto readSize = std::fread(buffer, sizeof(char), size, m_File);
        ProfilerStop("read");

        CheckFile("couldn't read to file " + m_Name + ", in call to stdio fread");

        if (readSize != size)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::file::FileStdio", "Read",
                "read size of " + std::to_string(readSize) + " is not equal to intended size " +
                    std::to_string(size) + " in file " + m_Name + ", in call to stdio fread");
        }
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        const auto status = std::fseek(m_File, static_cast<long int>(start), SEEK_SET);
        CheckFile("couldn't move to start position " + std::to_string(start) + " in file " +
                  m_Name + ", in call to stdio fseek for read, result=" + std::to_string(status));
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Read(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Read(&buffer[position], remainder);
    }
    else
    {
        lf_Read(buffer, size);
    }
}